

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

long ov_read_float(OggVorbis_File *vf,float ***pcm_channels,int length,int *bitstream)

{
  int iVar1;
  int ret;
  int hs;
  long samples;
  float **pcm;
  int *bitstream_local;
  float ***pppfStack_20;
  int length_local;
  float ***pcm_channels_local;
  OggVorbis_File *vf_local;
  
  pcm = (float **)bitstream;
  bitstream_local._4_4_ = length;
  pppfStack_20 = pcm_channels;
  pcm_channels_local = (float ***)vf;
  if (vf->ready_state < 2) {
    vf_local = (OggVorbis_File *)0xffffffffffffff7d;
  }
  else {
    do {
      if (*(int *)(pcm_channels_local + 0x10) == 4) {
        iVar1 = vorbis_synthesis_pcmout
                          ((vorbis_dsp_state *)(pcm_channels_local + 0x48),(float ***)&samples);
        _ret = (long)iVar1;
        if (_ret != 0) {
          iVar1 = vorbis_synthesis_halfrate_p((vorbis_info *)pcm_channels_local[0xd]);
          if (pppfStack_20 != (float ***)0x0) {
            *pppfStack_20 = (float **)samples;
          }
          if (bitstream_local._4_4_ < _ret) {
            _ret = (long)bitstream_local._4_4_;
          }
          vorbis_synthesis_read((vorbis_dsp_state *)(pcm_channels_local + 0x48),(int)_ret);
          pcm_channels_local[0xf] =
               (float **)((_ret << ((byte)iVar1 & 0x3f)) + (long)pcm_channels_local[0xf]);
          if (pcm != (float **)0x0) {
            *(undefined4 *)pcm = *(undefined4 *)(pcm_channels_local + 0x12);
          }
          return _ret;
        }
      }
      iVar1 = _fetch_and_process_packet((OggVorbis_File *)pcm_channels_local,(ogg_packet *)0x0,1,1);
      if (iVar1 == -2) {
        return 0;
      }
    } while (0 < iVar1);
    vf_local = (OggVorbis_File *)(long)iVar1;
  }
  return (long)vf_local;
}

Assistant:

long ov_read_float(OggVorbis_File *vf,float ***pcm_channels,int length,
                   int *bitstream){

  if(vf->ready_state<OPENED)return(OV_EINVAL);

  while(1){
    if(vf->ready_state==INITSET){
      float **pcm;
      long samples=vorbis_synthesis_pcmout(&vf->vd,&pcm);
      if(samples){
        int hs=vorbis_synthesis_halfrate_p(vf->vi);
        if(pcm_channels)*pcm_channels=pcm;
        if(samples>length)samples=length;
        vorbis_synthesis_read(&vf->vd,samples);
        vf->pcm_offset+=samples<<hs;
        if(bitstream)*bitstream=vf->current_link;
        return samples;

      }
    }

    /* suck in another packet */
    {
      int ret=_fetch_and_process_packet(vf,NULL,1,1);
      if(ret==OV_EOF)return(0);
      if(ret<=0)return(ret);
    }

  }
}